

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O3

vector<trng::GF2,_256UL> * __thiscall
trng::xoshiro256plus::status_type::to_vector
          (vector<trng::GF2,_256UL> *__return_storage_ptr__,status_type *this)

{
  pointer pGVar1;
  result_type rVar2;
  byte bVar3;
  byte bVar7;
  byte bVar11;
  byte bVar13;
  byte bVar15;
  byte bVar19;
  byte bVar21;
  ushort uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  pointer __s;
  int i;
  long lVar47;
  undefined4 uVar48;
  undefined4 uVar67;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  long lVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar69;
  undefined1 auVar70 [16];
  long lVar76;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar77;
  undefined1 auVar75 [16];
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  long lVar105;
  long lVar106;
  long lVar110;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long local_58;
  long local_48;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar12;
  byte bVar14;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar20;
  
  __s = (pointer)operator_new(0x100);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x100;
  lVar47 = 0;
  memset(__s,0,0x100);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x100;
  rVar2 = this->r[0];
  do {
    __s[lVar47].value = (byte)((rVar2 << ((byte)lVar47 & 0x3f)) >> 0x3f);
    lVar47 = lVar47 + 1;
  } while (lVar47 != 0x40);
  auVar75 = *(undefined1 (*) [16])(this->r + 1);
  uVar48 = auVar75._0_4_;
  uVar67 = auVar75._4_4_;
  lVar47 = 0;
  auVar71 = _DAT_002a61b0;
  auVar85 = _DAT_002a61c0;
  auVar90 = _DAT_002a61d0;
  auVar93 = _DAT_002a61e0;
  auVar96 = _DAT_002a61f0;
  auVar99 = _DAT_002a6200;
  auVar102 = _DAT_002a6210;
  auVar107 = _DAT_002a00b0;
  do {
    lVar69 = auVar75._0_8_;
    lVar78 = lVar69 << auVar102._0_8_;
    auVar49._0_8_ = auVar102._8_8_;
    auVar49._8_4_ = auVar102._8_4_;
    auVar49._12_4_ = auVar102._12_4_;
    auVar23._8_4_ = uVar48;
    auVar23._0_8_ = lVar69;
    auVar23._12_4_ = uVar67;
    lVar105 = auVar23._8_8_ << auVar49._8_8_;
    auVar50._0_8_ = auVar107._8_8_;
    auVar50._8_4_ = auVar107._8_4_;
    auVar50._12_4_ = auVar107._12_4_;
    auVar24._8_4_ = uVar48;
    auVar24._0_8_ = lVar69;
    auVar24._12_4_ = uVar67;
    lVar110 = auVar24._8_8_ << auVar50._8_8_;
    auVar51._0_8_ = auVar96._8_8_;
    auVar51._8_4_ = auVar96._8_4_;
    auVar51._12_4_ = auVar96._12_4_;
    auVar25._8_4_ = uVar48;
    auVar25._0_8_ = lVar69;
    auVar25._12_4_ = uVar67;
    lVar112 = auVar25._8_8_ << auVar51._8_8_;
    auVar52._0_8_ = auVar99._8_8_;
    auVar52._8_4_ = auVar99._8_4_;
    auVar52._12_4_ = auVar99._12_4_;
    auVar26._8_4_ = uVar48;
    auVar26._0_8_ = lVar69;
    auVar26._12_4_ = uVar67;
    lVar111 = auVar26._8_8_ << auVar52._8_8_;
    auVar53._0_8_ = auVar90._8_8_;
    auVar53._8_4_ = auVar90._8_4_;
    auVar53._12_4_ = auVar90._12_4_;
    auVar27._8_4_ = uVar48;
    auVar27._0_8_ = lVar69;
    auVar27._12_4_ = uVar67;
    lVar114 = auVar27._8_8_ << auVar53._8_8_;
    auVar54._0_8_ = auVar93._8_8_;
    auVar54._8_4_ = auVar93._8_4_;
    auVar54._12_4_ = auVar93._12_4_;
    auVar28._8_4_ = uVar48;
    auVar28._0_8_ = lVar69;
    auVar28._12_4_ = uVar67;
    lVar113 = auVar28._8_8_ << auVar54._8_8_;
    auVar70._8_4_ = auVar71._8_4_;
    auVar70._12_4_ = auVar71._12_4_;
    lVar77 = auVar71._8_8_;
    auVar70._0_8_ = lVar77;
    auVar29._8_4_ = uVar48;
    auVar29._0_8_ = lVar69;
    auVar29._12_4_ = uVar67;
    lVar68 = auVar29._8_8_ << auVar70._8_8_;
    auVar84._8_4_ = auVar85._8_4_;
    auVar84._12_4_ = auVar85._12_4_;
    lVar106 = auVar85._8_8_;
    auVar84._0_8_ = lVar106;
    auVar30._8_4_ = uVar48;
    auVar30._0_8_ = lVar69;
    auVar30._12_4_ = uVar67;
    lVar76 = auVar30._8_8_ << auVar84._8_8_;
    local_58 = auVar107._0_8_;
    lVar79 = lVar69 << auVar96._0_8_;
    lVar81 = lVar69 << auVar99._0_8_;
    local_48 = auVar90._0_8_;
    lVar82 = lVar69 << auVar93._0_8_;
    lVar80 = lVar69 << auVar71._0_8_;
    lVar83 = lVar69 << auVar85._0_8_;
    uVar22 = -(short)(lVar83 >> 0x3f);
    bVar3 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar83 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar76 >> 0x3f);
    bVar4 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar76 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar80 >> 0x3f);
    bVar5 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar80 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar68 >> 0x3f);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar68 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar82 >> 0x3f);
    bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar82 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar113 >> 0x3f);
    bVar8 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar113 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((lVar69 << local_48) >> 0x3f);
    bVar9 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((lVar69 << local_48) >> 0x3f) -
            (0xff < uVar22);
    uVar22 = -(short)(lVar114 >> 0x3f);
    bVar10 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar114 >> 0x3f) - (0xff < uVar22);
    bVar11 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar12 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    bVar8 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    bVar7 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    bVar3 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    bVar4 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar5 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    uVar22 = -(short)(lVar81 >> 0x3f);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar81 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar111 >> 0x3f);
    bVar10 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar111 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar79 >> 0x3f);
    bVar13 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar79 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar112 >> 0x3f);
    bVar14 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar112 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((lVar69 << local_58) >> 0x3f);
    bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((lVar69 << local_58) >> 0x3f) -
             (0xff < uVar22);
    uVar22 = -(short)(lVar110 >> 0x3f);
    bVar16 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar110 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar78 >> 0x3f);
    bVar17 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar78 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar105 >> 0x3f);
    bVar18 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar105 >> 0x3f) - (0xff < uVar22);
    bVar19 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar15 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar20 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    bVar17 = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
    bVar18 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar16 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    bVar10 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    bVar6 = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
    pGVar1 = __s + lVar47 + 0x40;
    pGVar1->value = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
    pGVar1[1].value = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    pGVar1[2].value = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
    pGVar1[3].value = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    pGVar1[4].value = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
    pGVar1[5].value = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    pGVar1[6].value = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    pGVar1[7].value = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    pGVar1[8].value = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    pGVar1[9].value = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    pGVar1[10].value = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    pGVar1[0xb].value = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    pGVar1[0xc].value = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    pGVar1[0xd].value = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    pGVar1[0xe].value = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    pGVar1[0xf].value = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    lVar47 = lVar47 + 0x10;
    auVar107._0_8_ = local_58 + 0x10;
    auVar107._8_8_ = auVar50._0_8_ + 0x10;
    auVar102._0_8_ = auVar102._0_8_ + 0x10;
    auVar102._8_8_ = auVar49._0_8_ + 0x10;
    auVar99._0_8_ = auVar99._0_8_ + 0x10;
    auVar99._8_8_ = auVar52._0_8_ + 0x10;
    auVar96._0_8_ = auVar96._0_8_ + 0x10;
    auVar96._8_8_ = auVar51._0_8_ + 0x10;
    auVar93._0_8_ = auVar93._0_8_ + 0x10;
    auVar93._8_8_ = auVar54._0_8_ + 0x10;
    auVar90._0_8_ = local_48 + 0x10;
    auVar90._8_8_ = auVar53._0_8_ + 0x10;
    auVar85._0_8_ = auVar85._0_8_ + 0x10;
    auVar85._8_8_ = lVar106 + 0x10;
    auVar71._0_8_ = auVar71._0_8_ + 0x10;
    auVar71._8_8_ = lVar77 + 0x10;
  } while (lVar47 != 0x40);
  auVar75 = *(undefined1 (*) [16])(this->r + 2);
  uVar48 = auVar75._0_4_;
  uVar67 = auVar75._4_4_;
  lVar47 = 0;
  auVar73 = _DAT_002a61b0;
  auVar87 = _DAT_002a61c0;
  auVar91 = _DAT_002a61d0;
  auVar94 = _DAT_002a61e0;
  auVar97 = _DAT_002a61f0;
  auVar100 = _DAT_002a6200;
  auVar103 = _DAT_002a6210;
  auVar108 = _DAT_002a00b0;
  do {
    lVar69 = auVar75._0_8_;
    lVar78 = lVar69 << auVar103._0_8_;
    auVar55._0_8_ = auVar103._8_8_;
    auVar55._8_4_ = auVar103._8_4_;
    auVar55._12_4_ = auVar103._12_4_;
    auVar31._8_4_ = uVar48;
    auVar31._0_8_ = lVar69;
    auVar31._12_4_ = uVar67;
    lVar105 = auVar31._8_8_ << auVar55._8_8_;
    auVar56._0_8_ = auVar108._8_8_;
    auVar56._8_4_ = auVar108._8_4_;
    auVar56._12_4_ = auVar108._12_4_;
    auVar32._8_4_ = uVar48;
    auVar32._0_8_ = lVar69;
    auVar32._12_4_ = uVar67;
    lVar110 = auVar32._8_8_ << auVar56._8_8_;
    auVar57._0_8_ = auVar97._8_8_;
    auVar57._8_4_ = auVar97._8_4_;
    auVar57._12_4_ = auVar97._12_4_;
    auVar33._8_4_ = uVar48;
    auVar33._0_8_ = lVar69;
    auVar33._12_4_ = uVar67;
    lVar112 = auVar33._8_8_ << auVar57._8_8_;
    auVar58._0_8_ = auVar100._8_8_;
    auVar58._8_4_ = auVar100._8_4_;
    auVar58._12_4_ = auVar100._12_4_;
    auVar34._8_4_ = uVar48;
    auVar34._0_8_ = lVar69;
    auVar34._12_4_ = uVar67;
    lVar111 = auVar34._8_8_ << auVar58._8_8_;
    auVar59._0_8_ = auVar91._8_8_;
    auVar59._8_4_ = auVar91._8_4_;
    auVar59._12_4_ = auVar91._12_4_;
    auVar35._8_4_ = uVar48;
    auVar35._0_8_ = lVar69;
    auVar35._12_4_ = uVar67;
    lVar114 = auVar35._8_8_ << auVar59._8_8_;
    auVar60._0_8_ = auVar94._8_8_;
    auVar60._8_4_ = auVar94._8_4_;
    auVar60._12_4_ = auVar94._12_4_;
    auVar36._8_4_ = uVar48;
    auVar36._0_8_ = lVar69;
    auVar36._12_4_ = uVar67;
    lVar113 = auVar36._8_8_ << auVar60._8_8_;
    auVar72._8_4_ = auVar73._8_4_;
    auVar72._12_4_ = auVar73._12_4_;
    lVar77 = auVar73._8_8_;
    auVar72._0_8_ = lVar77;
    auVar37._8_4_ = uVar48;
    auVar37._0_8_ = lVar69;
    auVar37._12_4_ = uVar67;
    lVar68 = auVar37._8_8_ << auVar72._8_8_;
    auVar86._8_4_ = auVar87._8_4_;
    auVar86._12_4_ = auVar87._12_4_;
    lVar106 = auVar87._8_8_;
    auVar86._0_8_ = lVar106;
    auVar38._8_4_ = uVar48;
    auVar38._0_8_ = lVar69;
    auVar38._12_4_ = uVar67;
    lVar76 = auVar38._8_8_ << auVar86._8_8_;
    local_58 = auVar108._0_8_;
    lVar79 = lVar69 << auVar97._0_8_;
    lVar81 = lVar69 << auVar100._0_8_;
    local_48 = auVar91._0_8_;
    lVar82 = lVar69 << auVar94._0_8_;
    lVar80 = lVar69 << auVar73._0_8_;
    lVar83 = lVar69 << auVar87._0_8_;
    uVar22 = -(short)(lVar83 >> 0x3f);
    bVar4 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar83 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar76 >> 0x3f);
    bVar5 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar76 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar80 >> 0x3f);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar80 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar68 >> 0x3f);
    bVar3 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar68 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar82 >> 0x3f);
    bVar10 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar82 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar113 >> 0x3f);
    bVar9 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar113 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((lVar69 << local_48) >> 0x3f);
    bVar8 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((lVar69 << local_48) >> 0x3f) -
            (0xff < uVar22);
    uVar22 = -(short)(lVar114 >> 0x3f);
    bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar114 >> 0x3f) - (0xff < uVar22);
    bVar10 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    uVar22 = -(short)(lVar81 >> 0x3f);
    bVar12 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar81 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar111 >> 0x3f);
    bVar13 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar111 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar79 >> 0x3f);
    bVar14 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar79 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar112 >> 0x3f);
    bVar11 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar112 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((lVar69 << local_58) >> 0x3f);
    bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((lVar69 << local_58) >> 0x3f) -
             (0xff < uVar22);
    uVar22 = -(short)(lVar110 >> 0x3f);
    bVar16 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar110 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar78 >> 0x3f);
    bVar17 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar78 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar105 >> 0x3f);
    bVar18 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar105 >> 0x3f) - (0xff < uVar22);
    bVar21 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar19 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar20 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    bVar17 = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
    bVar16 = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    bVar15 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    bVar13 = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
    bVar12 = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    pGVar1 = __s + lVar47 + 0x80;
    pGVar1->value = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
    pGVar1[1].value = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
    pGVar1[2].value = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
    pGVar1[3].value = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    pGVar1[4].value = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    pGVar1[5].value = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    pGVar1[6].value = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    pGVar1[7].value = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    pGVar1[8].value = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    pGVar1[9].value = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    pGVar1[10].value = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    pGVar1[0xb].value = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    pGVar1[0xc].value = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    pGVar1[0xd].value = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    pGVar1[0xe].value = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    pGVar1[0xf].value = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    lVar47 = lVar47 + 0x10;
    auVar108._0_8_ = local_58 + 0x10;
    auVar108._8_8_ = auVar56._0_8_ + 0x10;
    auVar103._0_8_ = auVar103._0_8_ + 0x10;
    auVar103._8_8_ = auVar55._0_8_ + 0x10;
    auVar100._0_8_ = auVar100._0_8_ + 0x10;
    auVar100._8_8_ = auVar58._0_8_ + 0x10;
    auVar97._0_8_ = auVar97._0_8_ + 0x10;
    auVar97._8_8_ = auVar57._0_8_ + 0x10;
    auVar94._0_8_ = auVar94._0_8_ + 0x10;
    auVar94._8_8_ = auVar60._0_8_ + 0x10;
    auVar91._0_8_ = local_48 + 0x10;
    auVar91._8_8_ = auVar59._0_8_ + 0x10;
    auVar87._0_8_ = auVar87._0_8_ + 0x10;
    auVar87._8_8_ = lVar106 + 0x10;
    auVar73._0_8_ = auVar73._0_8_ + 0x10;
    auVar73._8_8_ = lVar77 + 0x10;
  } while (lVar47 != 0x40);
  rVar2 = this->r[3];
  uVar48 = (undefined4)rVar2;
  uVar67 = (undefined4)(rVar2 >> 0x20);
  lVar47 = 0;
  auVar75 = _DAT_002a61b0;
  auVar89 = _DAT_002a61c0;
  auVar92 = _DAT_002a61d0;
  auVar95 = _DAT_002a61e0;
  auVar98 = _DAT_002a61f0;
  auVar101 = _DAT_002a6200;
  auVar104 = _DAT_002a6210;
  auVar109 = _DAT_002a00b0;
  do {
    lVar76 = rVar2 << auVar104._0_8_;
    auVar61._0_8_ = auVar104._8_8_;
    auVar61._8_4_ = auVar104._8_4_;
    auVar61._12_4_ = auVar104._12_4_;
    auVar39._8_4_ = uVar48;
    auVar39._0_8_ = rVar2;
    auVar39._12_4_ = uVar67;
    lVar106 = auVar39._8_8_ << auVar61._8_8_;
    auVar62._0_8_ = auVar109._8_8_;
    auVar62._8_4_ = auVar109._8_4_;
    auVar62._12_4_ = auVar109._12_4_;
    auVar40._8_4_ = uVar48;
    auVar40._0_8_ = rVar2;
    auVar40._12_4_ = uVar67;
    lVar105 = auVar40._8_8_ << auVar62._8_8_;
    auVar63._0_8_ = auVar98._8_8_;
    auVar63._8_4_ = auVar98._8_4_;
    auVar63._12_4_ = auVar98._12_4_;
    auVar41._8_4_ = uVar48;
    auVar41._0_8_ = rVar2;
    auVar41._12_4_ = uVar67;
    lVar111 = auVar41._8_8_ << auVar63._8_8_;
    auVar64._0_8_ = auVar101._8_8_;
    auVar64._8_4_ = auVar101._8_4_;
    auVar64._12_4_ = auVar101._12_4_;
    auVar42._8_4_ = uVar48;
    auVar42._0_8_ = rVar2;
    auVar42._12_4_ = uVar67;
    lVar110 = auVar42._8_8_ << auVar64._8_8_;
    auVar65._0_8_ = auVar92._8_8_;
    auVar65._8_4_ = auVar92._8_4_;
    auVar65._12_4_ = auVar92._12_4_;
    auVar43._8_4_ = uVar48;
    auVar43._0_8_ = rVar2;
    auVar43._12_4_ = uVar67;
    lVar113 = auVar43._8_8_ << auVar65._8_8_;
    auVar66._0_8_ = auVar95._8_8_;
    auVar66._8_4_ = auVar95._8_4_;
    auVar66._12_4_ = auVar95._12_4_;
    auVar44._8_4_ = uVar48;
    auVar44._0_8_ = rVar2;
    auVar44._12_4_ = uVar67;
    lVar112 = auVar44._8_8_ << auVar66._8_8_;
    auVar74._8_4_ = auVar75._8_4_;
    auVar74._12_4_ = auVar75._12_4_;
    lVar68 = auVar75._8_8_;
    auVar74._0_8_ = lVar68;
    auVar45._8_4_ = uVar48;
    auVar45._0_8_ = rVar2;
    auVar45._12_4_ = uVar67;
    lVar69 = auVar45._8_8_ << auVar74._8_8_;
    auVar88._8_4_ = auVar89._8_4_;
    auVar88._12_4_ = auVar89._12_4_;
    lVar83 = auVar89._8_8_;
    auVar88._0_8_ = lVar83;
    auVar46._8_4_ = uVar48;
    auVar46._0_8_ = rVar2;
    auVar46._12_4_ = uVar67;
    lVar77 = auVar46._8_8_ << auVar88._8_8_;
    local_58 = auVar109._0_8_;
    lVar78 = rVar2 << auVar98._0_8_;
    lVar80 = rVar2 << auVar101._0_8_;
    local_48 = auVar92._0_8_;
    lVar81 = rVar2 << auVar95._0_8_;
    lVar79 = rVar2 << auVar75._0_8_;
    lVar82 = rVar2 << auVar89._0_8_;
    uVar22 = -(short)(lVar82 >> 0x3f);
    bVar4 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar82 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar77 >> 0x3f);
    bVar5 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar77 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar79 >> 0x3f);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar79 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar69 >> 0x3f);
    bVar3 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar69 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar81 >> 0x3f);
    bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar81 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar112 >> 0x3f);
    bVar8 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar112 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((long)(rVar2 << local_48) >> 0x3f);
    bVar9 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((long)(rVar2 << local_48) >> 0x3f) -
            (0xff < uVar22);
    uVar22 = -(short)(lVar113 >> 0x3f);
    bVar10 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar113 >> 0x3f) - (0xff < uVar22);
    bVar11 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar7 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar12 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    bVar9 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    bVar10 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    bVar8 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar5 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar4 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    uVar22 = -(short)(lVar80 >> 0x3f);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar80 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar110 >> 0x3f);
    bVar3 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar110 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar78 >> 0x3f);
    bVar13 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar78 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar111 >> 0x3f);
    bVar14 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar111 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)((long)(rVar2 << local_58) >> 0x3f);
    bVar18 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)((long)(rVar2 << local_58) >> 0x3f) -
             (0xff < uVar22);
    uVar22 = -(short)(lVar105 >> 0x3f);
    bVar17 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar105 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar76 >> 0x3f);
    bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar76 >> 0x3f) - (0xff < uVar22);
    uVar22 = -(short)(lVar106 >> 0x3f);
    bVar16 = (uVar22 != 0) * (uVar22 < 0x100) * -(char)(lVar106 >> 0x3f) - (0xff < uVar22);
    bVar18 = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
    bVar17 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    bVar15 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar16 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    bVar13 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    bVar14 = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
    pGVar1 = __s + lVar47 + 0xc0;
    pGVar1->value = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
    pGVar1[1].value = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    pGVar1[2].value = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    pGVar1[3].value = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    pGVar1[4].value = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    pGVar1[5].value = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    pGVar1[6].value = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    pGVar1[7].value = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
    pGVar1[8].value = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    pGVar1[9].value = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    pGVar1[10].value = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    pGVar1[0xb].value = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    pGVar1[0xc].value = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    pGVar1[0xd].value = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    pGVar1[0xe].value = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    pGVar1[0xf].value = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    lVar47 = lVar47 + 0x10;
    auVar109._0_8_ = local_58 + 0x10;
    auVar109._8_8_ = auVar62._0_8_ + 0x10;
    auVar104._0_8_ = auVar104._0_8_ + 0x10;
    auVar104._8_8_ = auVar61._0_8_ + 0x10;
    auVar101._0_8_ = auVar101._0_8_ + 0x10;
    auVar101._8_8_ = auVar64._0_8_ + 0x10;
    auVar98._0_8_ = auVar98._0_8_ + 0x10;
    auVar98._8_8_ = auVar63._0_8_ + 0x10;
    auVar95._0_8_ = auVar95._0_8_ + 0x10;
    auVar95._8_8_ = auVar66._0_8_ + 0x10;
    auVar92._0_8_ = local_48 + 0x10;
    auVar92._8_8_ = auVar65._0_8_ + 0x10;
    auVar89._0_8_ = auVar89._0_8_ + 0x10;
    auVar89._8_8_ = lVar83 + 0x10;
    auVar75._0_8_ = auVar75._0_8_ + 0x10;
    auVar75._8_8_ = lVar68 + 0x10;
  } while (lVar47 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

vector<GF2, 256> to_vector() const {
        vector<GF2, 256> res;
        const result_type mask{result_type(1) << 63};
        for (int i{0}; i < 64; ++i)
          res(i) = GF2(((r[0] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 64) = GF2(((r[1] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 2 * 64) = GF2(((r[2] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 3 * 64) = GF2(((r[3] << i) & mask) > 0);
        return res;
      }